

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprSetHeight(Expr *p)

{
  int iVar1;
  int iVar2;
  Select *p_00;
  uint uVar3;
  long lVar4;
  Select **ppSVar5;
  int local_14;
  
  local_14 = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_14 = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_14 < iVar1)) {
    local_14 = iVar1;
  }
  p_00 = (Select *)(p->x).pList;
  if ((p->flags >> 0xb & 1) == 0) {
    if (p_00 != (Select *)0x0) {
      iVar1 = *(int *)&p_00->pEList;
      if ((long)iVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        ppSVar5 = (Select **)&p_00->op;
        do {
          if (((Expr *)*ppSVar5 != (Expr *)0x0) &&
             (iVar2 = ((Expr *)*ppSVar5)->nHeight, local_14 < iVar2)) {
            local_14 = iVar2;
          }
          lVar4 = lVar4 + 1;
          ppSVar5 = ppSVar5 + 4;
        } while (lVar4 < iVar1);
        lVar4 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | *(uint *)(*(long *)(&p_00->op + lVar4) + 4);
          lVar4 = lVar4 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar4);
        uVar3 = uVar3 & 0x200100;
      }
      p->flags = uVar3 | p->flags;
    }
  }
  else {
    heightOfSelect(p_00,&local_14);
  }
  p->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}